

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.hpp
# Opt level: O1

bool __thiscall
rek::Solver::hasConvergedDense
          (Solver *this,Matrix<double,__1,__1,_1,__1,__1> *A,
          Matrix<double,__1,__1,_0,__1,__1> *AColMajor,RowVector *x,RowVector *b,RowVector *z,
          double tolerance)

{
  ulong uVar1;
  ulong uVar2;
  Matrix<double,__1,__1,_0,__1,__1> *pMVar3;
  undefined8 *puVar4;
  char *pcVar5;
  bool bVar6;
  double dVar7;
  RowVector residual;
  RowVector zA;
  scalar_sum_op<double,_double> local_99;
  Matrix<double,__1,__1,_0,__1,__1> *local_98;
  ulong uStack_90;
  double local_80;
  Matrix<double,__1,__1,_0,__1,__1> *local_78;
  long local_70;
  CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_68;
  RowVector *local_58;
  Matrix<double,__1,__1,_0,__1,__1> *local_50;
  RowVector *local_48;
  RowVector *local_40;
  RowVector *local_30;
  
  local_80 = tolerance;
  if ((A->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_cols !=
      (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
    pcVar5 = 
    "Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1, 1>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
    ;
LAB_00104580:
    __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                  ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,pcVar5);
  }
  uVar1 = (b->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if ((A->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_rows !=
      uVar1) {
    pcVar5 = 
    "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Matrix<double, -1, 1>>, Rhs = const Eigen::Matrix<double, -1, 1>]"
    ;
LAB_001044f5:
    __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                  "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,pcVar5);
  }
  uVar2 = (z->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  local_50 = (Matrix<double,__1,__1,_0,__1,__1> *)A;
  local_48 = x;
  local_40 = b;
  local_30 = z;
  if (uVar1 != uVar2) {
    pcVar5 = 
    "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, Rhs = const Eigen::Matrix<double, -1, 1>]"
    ;
    goto LAB_001044f5;
  }
  local_98 = (Matrix<double,__1,__1,_0,__1,__1> *)0x0;
  uStack_90 = 0;
  if ((long)uVar2 < 0) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  pMVar3 = local_98;
  if (uVar2 != 0) {
    free((void *)0x0);
    if (uVar2 == 0) {
      local_98 = (Matrix<double,__1,__1,_0,__1,__1> *)0x0;
      pMVar3 = local_98;
    }
    else {
      if (uVar2 >> 0x3d != 0) {
LAB_0010453d:
        puVar4 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar4 = std::__ostream_insert<char,std::char_traits<char>>;
        __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      pMVar3 = (Matrix<double,__1,__1,_0,__1,__1> *)malloc(uVar2 * 8);
      if (uVar2 != 1 && ((ulong)pMVar3 & 0xf) != 0) {
        __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                      ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                      "void *Eigen::internal::aligned_malloc(std::size_t)");
      }
      if (pMVar3 == (Matrix<double,__1,__1,_0,__1,__1> *)0x0) goto LAB_0010453d;
    }
  }
  local_98 = pMVar3;
  uStack_90 = uVar2;
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)&local_98,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              *)&local_58,(assign_op<double,_double> *)&local_68);
  local_68.m_xpr = (XprTypeNested)&local_98;
  if (uStack_90 == 0) {
    dVar7 = 0.0;
  }
  else {
    if ((long)uStack_90 < 1) goto LAB_0010451e;
    local_50 = local_98;
    dVar7 = Eigen::internal::
            redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
            ::
            run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                      ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        *)&local_58,(scalar_sum_op<double,_double> *)&local_78,&local_68);
  }
  if (local_80 <= SQRT(dVar7)) {
    bVar6 = false;
  }
  else {
    if ((z->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
        (AColMajor->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
        m_rows) {
      pcVar5 = 
      "Eigen::Product<Eigen::Transpose<const Eigen::Matrix<double, -1, 1>>, Eigen::Matrix<double, -1, -1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Transpose<const Eigen::Matrix<double, -1, 1>>, Rhs = Eigen::Matrix<double, -1, -1>, Option = 0]"
      ;
      goto LAB_00104580;
    }
    local_58 = z;
    local_50 = AColMajor;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_78,
               (DenseBase<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                *)&local_58);
    local_68.m_xpr = (XprTypeNested)&local_78;
    if (local_70 == 0) {
      dVar7 = 0.0;
    }
    else {
      if (local_70 < 1) {
LAB_0010451e:
        __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                      "/usr/include/eigen3/Eigen/src/Core/Redux.h",0x19b,
                      "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Matrix<double, -1, 1>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Matrix<double, -1, 1>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
                     );
      }
      local_50 = local_78;
      dVar7 = Eigen::internal::
              redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
              ::
              run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                        ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                          *)&local_58,&local_99,&local_68);
    }
    bVar6 = SQRT(dVar7) < local_80;
    free(local_78);
  }
  free(local_98);
  return bVar6;
}

Assistant:

bool hasConvergedDense(Matrix<double, Dynamic, Dynamic, RowMajor> &A,
                         Matrix<double, Dynamic, Dynamic, ColMajor> &AColMajor,
                         const RowVector &x, const RowVector &b,
                         const RowVector &z, double tolerance) const {
    const RowVector residual = A * x - b + z;
    const bool condOne = residual.norm() < tolerance;

    // Early return
    if (!condOne) return false;

    const RowVector zA = z.transpose() * AColMajor;
    return zA.norm() < tolerance;
  }